

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBox::insertItems(QComboBox *this,int index,QStringList *list)

{
  QPersistentModelIndex *this_00;
  QComboBoxPrivate *this_01;
  ulong uVar1;
  QAbstractItemModel *pQVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  P _b;
  QStandardItemModel *pQVar7;
  QStandardItem *this_02;
  P _a;
  ulong uVar8;
  long lVar9;
  long in_FS_OFFSET;
  QList_conflict *local_c0;
  QModelIndex local_90;
  PrivateShared *local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((list->d).size != 0) {
    this_01 = *(QComboBoxPrivate **)&(this->super_QWidget).field_0x8;
    uVar4 = count(this);
    if ((int)uVar4 < index) {
      index = uVar4;
    }
    local_c0 = (QList_conflict *)0x0;
    if (0 < index) {
      local_c0 = (QList_conflict *)(ulong)(uint)index;
    }
    uVar8 = (long)this_01->maxCount - (long)local_c0;
    uVar1 = (list->d).size;
    if ((long)uVar1 < (long)uVar8) {
      uVar8 = uVar1;
    }
    uVar4 = (uint)uVar8;
    if (0 < (int)uVar4) {
      pQVar7 = QtPrivate::qobject_cast_helper<QStandardItemModel*,QObject>
                         ((QObject *)this_01->model);
      if (pQVar7 == (QStandardItemModel *)0x0) {
        this_01->field_0x34c = this_01->field_0x34c | 8;
        pQVar2 = this_01->model;
        this_00 = &this_01->root;
        QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
        iVar5 = (int)local_c0;
        cVar3 = (**(code **)(*(long *)pQVar2 + 0xf8))(pQVar2,local_c0,uVar8 & 0xffffffff,&local_58);
        if (cVar3 == '\0') {
          this_01->field_0x34c = this_01->field_0x34c & 0xf7;
        }
        else {
          local_78 = (PrivateShared *)0xffffffffffffffff;
          uStack_70 = 0;
          uStack_68 = 0;
          for (lVar9 = 0; (ulong)(uVar4 & 0x7fffffff) * 0x18 != lVar9; lVar9 = lVar9 + 0x18) {
            pQVar2 = this_01->model;
            iVar6 = this_01->modelColumn;
            QPersistentModelIndex::operator_cast_to_QModelIndex(&local_90,this_00);
            (**(code **)(*(long *)pQVar2 + 0x60))(&local_58,pQVar2,local_c0,iVar6,&local_90);
            uStack_68 = local_58._16_8_;
            local_78 = local_58.shared;
            uStack_70 = local_58._8_8_;
            pQVar2 = this_01->model;
            ::QVariant::QVariant
                      ((QVariant *)&local_58,(QString *)((long)&(((list->d).ptr)->d).d + lVar9));
            (**(code **)(*(long *)pQVar2 + 0x98))(pQVar2,&local_78,&local_58,2);
            ::QVariant::~QVariant((QVariant *)&local_58);
            local_c0 = (QList_conflict *)(ulong)((int)local_c0 + 1);
          }
          this_01->field_0x34c = this_01->field_0x34c & 0xf7;
          QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
          QComboBoxPrivate::rowsInserted(this_01,(QModelIndex *)&local_58,iVar5,iVar5 + uVar4 + -1);
        }
      }
      else {
        local_58.shared = (PrivateShared *)0x0;
        local_58._8_8_ = 0;
        local_58._16_8_ = 0;
        QList<QStandardItem_*>::reserve
                  ((QList<QStandardItem_*> *)&local_58,(ulong)(uVar4 & 0x7fffffff));
        iVar5 = QStandardItemModel::invisibleRootItem();
        for (lVar9 = 0; (ulong)(uVar4 & 0x7fffffff) * 0x18 - lVar9 != 0; lVar9 = lVar9 + 0x18) {
          this_02 = (QStandardItem *)operator_new(0x10);
          QStandardItem::QStandardItem(this_02,(QString *)((long)&(((list->d).ptr)->d).d + lVar9));
          QList<QStandardItem_*>::append((QList<QStandardItem_*> *)&local_58,this_02);
        }
        QStandardItem::insertRows(iVar5,local_c0);
        QArrayDataPointer<QStandardItem_*>::~QArrayDataPointer
                  ((QArrayDataPointer<QStandardItem_*> *)&local_58);
      }
      iVar6 = count(this);
      iVar5 = this_01->maxCount;
      if (iVar6 - iVar5 != 0 && iVar5 <= iVar6) {
        pQVar2 = this_01->model;
        QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,&this_01->root)
        ;
        (**(code **)(*(long *)pQVar2 + 0x108))(pQVar2,iVar5,iVar6 - iVar5,&local_58);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBox::insertItems(int index, const QStringList &list)
{
    Q_D(QComboBox);
    if (list.isEmpty())
        return;
    index = qBound(0, index, count());
    int insertCount = qMin(d->maxCount - index, list.size());
    if (insertCount <= 0)
        return;
    // For the common case where we are using the built in QStandardItemModel
    // construct a QStandardItem, reducing the number of expensive signals from the model
    if (QStandardItemModel *m = qobject_cast<QStandardItemModel*>(d->model)) {
        QList<QStandardItem *> items;
        items.reserve(insertCount);
        QStandardItem *hiddenRoot = m->invisibleRootItem();
        for (int i = 0; i < insertCount; ++i)
            items.append(new QStandardItem(list.at(i)));
        hiddenRoot->insertRows(index, items);
    } else {
        d->inserting = true;
        if (d->model->insertRows(index, insertCount, d->root)) {
            QModelIndex item;
            for (int i = 0; i < insertCount; ++i) {
                item = d->model->index(i+index, d->modelColumn, d->root);
                d->model->setData(item, list.at(i), Qt::EditRole);
            }
            d->inserting = false;
            d->rowsInserted(d->root, index, index + insertCount - 1);
        } else {
            d->inserting = false;
        }
    }

    int mc = count();
    if (mc > d->maxCount)
        d->model->removeRows(d->maxCount, mc - d->maxCount, d->root);
}